

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle_BeagleJNIWrapper.cpp
# Opt level: O0

jint Java_beagle_BeagleJNIWrapper_updateTransitionMatricesWithMultipleModels
               (JNIEnv *env,jobject obj,jint instance,jintArray inEigenIndices,
               jintArray inCategoryRateIndices,jintArray inProbabilityIndices,
               jintArray inFirstDerivativeIndices,jintArray inSecondDerivativeIndices,
               jdoubleArray inEdgeLengths,jint count)

{
  jint jVar1;
  jint *pjVar2;
  jint *pjVar3;
  jint *pjVar4;
  JNIEnv_ *pJVar5;
  jdoubleArray p_Var6;
  jdouble *pjVar7;
  undefined4 in_EDX;
  long in_stack_00000008;
  long in_stack_00000010;
  undefined4 in_stack_00000020;
  jint errCode;
  jdouble *edgeLengths;
  jint *secondDerivativeIndices;
  jint *firstDerivativeIndices;
  jint *probabilityIndices;
  jint *categoryRateIndices;
  jint *eigenIndices;
  jdoubleArray in_stack_ffffffffffffff78;
  jint mode;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffff84;
  jdoubleArray array;
  JNIEnv_ *pJVar9;
  
  pjVar2 = JNIEnv_::GetIntArrayElements
                     ((JNIEnv_ *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (jintArray)in_stack_ffffffffffffff78,(jboolean *)0x1057ac);
  pjVar3 = JNIEnv_::GetIntArrayElements
                     ((JNIEnv_ *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (jintArray)in_stack_ffffffffffffff78,(jboolean *)0x1057c7);
  pjVar4 = JNIEnv_::GetIntArrayElements
                     ((JNIEnv_ *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (jintArray)in_stack_ffffffffffffff78,(jboolean *)0x1057e2);
  if (in_stack_00000008 == 0) {
    pJVar5 = (JNIEnv_ *)0x0;
  }
  else {
    pJVar5 = (JNIEnv_ *)
             JNIEnv_::GetIntArrayElements
                       ((JNIEnv_ *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        (jintArray)in_stack_ffffffffffffff78,(jboolean *)0x10580b);
  }
  pJVar9 = pJVar5;
  if (in_stack_00000010 == 0) {
    p_Var6 = (jdoubleArray)0x0;
  }
  else {
    p_Var6 = (jdoubleArray)
             JNIEnv_::GetIntArrayElements
                       ((JNIEnv_ *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        (jintArray)in_stack_ffffffffffffff78,(jboolean *)0x105849);
  }
  array = p_Var6;
  pjVar7 = JNIEnv_::GetDoubleArrayElements
                     ((JNIEnv_ *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      in_stack_ffffffffffffff78,(jboolean *)0x10587c);
  mode = (jint)((ulong)pjVar7 >> 0x20);
  jVar1 = beagleUpdateTransitionMatricesWithMultipleModels
                    (in_EDX,pjVar2,pjVar3,pjVar4,pJVar5,p_Var6);
  JNIEnv_::ReleaseDoubleArrayElements
            (pJVar9,array,(jdouble *)CONCAT44(in_stack_ffffffffffffff84,in_stack_00000020),mode);
  uVar8 = in_stack_00000020;
  if (in_stack_00000010 != 0) {
    JNIEnv_::ReleaseIntArrayElements
              (pJVar9,(jintArray)array,(jint *)CONCAT44(in_stack_ffffffffffffff84,in_stack_00000020)
               ,mode);
    uVar8 = in_stack_00000020;
  }
  if (in_stack_00000008 != 0) {
    JNIEnv_::ReleaseIntArrayElements
              (pJVar9,(jintArray)array,(jint *)CONCAT44(in_stack_ffffffffffffff84,uVar8),mode);
  }
  JNIEnv_::ReleaseIntArrayElements
            (pJVar9,(jintArray)array,(jint *)CONCAT44(in_stack_ffffffffffffff84,uVar8),mode);
  JNIEnv_::ReleaseIntArrayElements
            (pJVar9,(jintArray)array,(jint *)CONCAT44(in_stack_ffffffffffffff84,uVar8),mode);
  JNIEnv_::ReleaseIntArrayElements
            (pJVar9,(jintArray)array,(jint *)CONCAT44(in_stack_ffffffffffffff84,uVar8),mode);
  return jVar1;
}

Assistant:

JNIEXPORT jint JNICALL Java_beagle_BeagleJNIWrapper_updateTransitionMatricesWithMultipleModels
  (JNIEnv *env, jobject obj, jint instance, jintArray inEigenIndices, jintArray inCategoryRateIndices, jintArray inProbabilityIndices, jintArray inFirstDerivativeIndices, jintArray inSecondDerivativeIndices, jdoubleArray inEdgeLengths, jint count)
{
    jint *eigenIndices = env->GetIntArrayElements(inEigenIndices, NULL);
    jint *categoryRateIndices = env->GetIntArrayElements(inCategoryRateIndices, NULL);
    jint *probabilityIndices = env->GetIntArrayElements(inProbabilityIndices, NULL);
    jint *firstDerivativeIndices = inFirstDerivativeIndices != NULL ? env->GetIntArrayElements(inFirstDerivativeIndices, NULL) : NULL;
    jint *secondDerivativeIndices = inSecondDerivativeIndices != NULL ? env->GetIntArrayElements(inSecondDerivativeIndices, NULL) : NULL;
    jdouble *edgeLengths = env->GetDoubleArrayElements(inEdgeLengths, NULL);
    jint errCode = (jint)beagleUpdateTransitionMatricesWithMultipleModels(instance, (int *)eigenIndices, (int *)categoryRateIndices, (int *)probabilityIndices, (int *)firstDerivativeIndices, (int *)secondDerivativeIndices, (double *)edgeLengths, count);

    env->ReleaseDoubleArrayElements(inEdgeLengths, edgeLengths, JNI_ABORT);
    if (inSecondDerivativeIndices != NULL) env->ReleaseIntArrayElements(inSecondDerivativeIndices, secondDerivativeIndices, JNI_ABORT);
    if (inFirstDerivativeIndices != NULL) env->ReleaseIntArrayElements(inFirstDerivativeIndices, firstDerivativeIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(inProbabilityIndices, probabilityIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(inCategoryRateIndices, categoryRateIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(inEigenIndices, eigenIndices, JNI_ABORT);

    return errCode;
}